

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O1

BeagleBenchmarkedResourceList *
beagleGetBenchmarkedResourceList
          (int tipCount,int compactBufferCount,int stateCount,int patternCount,int categoryCount,
          int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
          int eigenModelCount,int partitionCount,int calculateDerivatives,long benchmarkFlags)

{
  BeagleResource *pBVar1;
  long *plVar2;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *plVar3;
  undefined8 uVar4;
  long lVar5;
  int rateCategoryCount;
  int iVar6;
  int iVar7;
  _List_node_base *possibleResources;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *this;
  _List_node_base *p_Var8;
  BeagleBenchmarkedResourceList *pBVar9;
  BeagleBenchmarkedResource *pBVar10;
  long lVar11;
  list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *plVar12;
  int rescaleFrequency;
  _List_node_base *p_Var13;
  double dVar14;
  int resourceNumber;
  int local_88;
  int local_84;
  ulong local_80;
  double benchmarkResultCPU;
  long benchedFlags;
  char *implName;
  double itBenchmarkResult;
  _List_node_base *local_58;
  _List_node_base *p_Stack_50;
  _List_node_base *p_Stack_48;
  _List_node_base *p_Stack_40;
  
  local_88 = patternCount;
  local_84 = categoryCount;
  if (rsrcList == (BeagleResourceList *)0x0) {
    beagleGetResourceList();
  }
  local_80 = (ulong)(uint)compactBufferCount;
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    beagleGetFactoryList_abi_cxx11_();
  }
  possibleResources = (_List_node_base *)operator_new(0x18);
  possibleResources->_M_prev = possibleResources;
  possibleResources->_M_next = possibleResources;
  possibleResources[1]._M_next = (_List_node_base *)0x0;
  iVar6 = filterResources(resourceList,resourceCount,preferenceFlags,requirementFlags,
                          (PairedList *)possibleResources);
  if (iVar6 == 0) {
    this = (list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> *)
           operator_new(0x18);
    *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)(this + 8) = this
    ;
    *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)this = this;
    *(undefined8 *)(this + 0x10) = 0;
    for (p_Var13 = possibleResources->_M_next; p_Var13 != possibleResources;
        p_Var13 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      iVar6 = *(int *)((long)&p_Var13[1]._M_next + 4);
      pBVar1 = rsrcList->list + iVar6;
      local_58 = (_List_node_base *)pBVar1->name;
      p_Stack_50 = (_List_node_base *)pBVar1->description;
      p_Stack_48 = (_List_node_base *)pBVar1->supportFlags;
      p_Stack_40 = (_List_node_base *)pBVar1->requiredFlags;
      p_Var8 = (_List_node_base *)operator_new(0x60);
      *(int *)&p_Var8[1]._M_next = iVar6;
      p_Var8[1]._M_prev = local_58;
      p_Var8[2]._M_next = p_Stack_50;
      p_Var8[2]._M_prev = p_Stack_48;
      p_Var8[3]._M_next = p_Stack_40;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    p_Var13 = possibleResources->_M_next;
    while (p_Var13 != possibleResources) {
      p_Var8 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var13);
      p_Var13 = p_Var8;
    }
    operator_delete(possibleResources);
    rateCategoryCount = local_84;
    iVar6 = local_88;
    rescaleFrequency = 1;
    if ((benchmarkFlags & 2U) == 0) {
      rescaleFrequency = 0x1e;
    }
    iVar7 = beagle::benchmark::benchmarkResource
                      (0,stateCount,tipCount,local_88,(benchmarkFlags & 1U) == 0,local_84,0xf,
                       (int)local_80,rescaleFrequency,calculateDerivatives != 0,
                       calculateDerivatives != 0,eigenModelCount,partitionCount,
                       requirementFlags | preferenceFlags,0,&resourceNumber,&implName,&benchedFlags,
                       &benchmarkResultCPU,false);
    pBVar9 = (BeagleBenchmarkedResourceList *)0x0;
    if (iVar7 == 0) {
      for (plVar3 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                     this; plVar3 != this;
          plVar3 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                    plVar3) {
        iVar7 = beagle::benchmark::benchmarkResource
                          (*(int *)(plVar3 + 0x10),stateCount,tipCount,iVar6,
                           (benchmarkFlags & 1U) == 0,rateCategoryCount,0xf,(int)local_80,
                           rescaleFrequency,calculateDerivatives != 0,calculateDerivatives != 0,
                           eigenModelCount,partitionCount,preferenceFlags,requirementFlags,
                           &resourceNumber,&implName,&benchedFlags,&itBenchmarkResult,
                           *(int *)(plVar3 + 0x10) == 0);
        *(int *)(plVar3 + 0x38) = iVar7;
        *(int *)(plVar3 + 0x10) = resourceNumber;
        *(long *)(plVar3 + 0x48) = benchedFlags;
        *(char **)(plVar3 + 0x40) = implName;
        if (resourceNumber == 0) {
          *(double *)(plVar3 + 0x50) = benchmarkResultCPU;
          dVar14 = 1.0;
        }
        else {
          *(double *)(plVar3 + 0x50) = itBenchmarkResult;
          dVar14 = benchmarkResultCPU / itBenchmarkResult;
        }
        *(double *)(plVar3 + 0x58) = dVar14;
      }
      std::__cxx11::list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>>::
      sort<bool(*)(BeagleBenchmarkedResource_const&,BeagleBenchmarkedResource_const&)>
                (this,compareBenchmarkResult);
      if (rsrcBenchList != (BeagleBenchmarkedResourceList *)0x0) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
      }
      pBVar9 = (BeagleBenchmarkedResourceList *)malloc(0x10);
      uVar4 = *(undefined8 *)(this + 0x10);
      rsrcBenchList = pBVar9;
      pBVar9->length = (int)uVar4;
      pBVar10 = (BeagleBenchmarkedResource *)malloc((long)(int)uVar4 * 0x50);
      pBVar9->list = pBVar10;
      plVar3 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)this;
      if (plVar3 != this) {
        lVar11 = 0;
        plVar12 = plVar3;
        do {
          pBVar10 = rsrcBenchList->list;
          *(undefined4 *)((long)&pBVar10->number + lVar11) = *(undefined4 *)(plVar12 + 0x10);
          *(long *)((long)&pBVar10->name + lVar11) = *(long *)(plVar12 + 0x18);
          *(long *)((long)&rsrcBenchList->list->description + lVar11) = *(long *)(plVar12 + 0x20);
          pBVar10 = rsrcBenchList->list;
          lVar5 = *(long *)(plVar12 + 0x30);
          plVar2 = (long *)((long)&pBVar10->supportFlags + lVar11);
          *plVar2 = *(long *)(plVar12 + 0x28);
          plVar2[1] = lVar5;
          *(undefined4 *)((long)&pBVar10->returnCode + lVar11) = *(undefined4 *)(plVar12 + 0x38);
          *(long *)((long)&pBVar10->implName + lVar11) = *(long *)(plVar12 + 0x40);
          pBVar10 = rsrcBenchList->list;
          *(long *)((long)&pBVar10->benchedFlags + lVar11) = *(long *)(plVar12 + 0x48);
          lVar5 = *(long *)(plVar12 + 0x58);
          plVar2 = (long *)((long)&pBVar10->benchmarkResult + lVar11);
          *plVar2 = *(long *)(plVar12 + 0x50);
          plVar2[1] = lVar5;
          plVar12 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                     plVar12;
          lVar11 = lVar11 + 0x50;
        } while (plVar12 != this);
      }
      while (plVar3 != this) {
        plVar12 = *(list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>> **)
                   plVar3;
        operator_delete(plVar3);
        plVar3 = plVar12;
      }
      operator_delete(this);
      pBVar9 = rsrcBenchList;
    }
  }
  else {
    p_Var13 = possibleResources->_M_next;
    while (p_Var13 != possibleResources) {
      p_Var8 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var13);
      p_Var13 = p_Var8;
    }
    operator_delete(possibleResources);
    pBVar9 = (BeagleBenchmarkedResourceList *)0x0;
  }
  return pBVar9;
}

Assistant:

BeagleBenchmarkedResourceList* beagleGetBenchmarkedResourceList(int tipCount,
                                                                int compactBufferCount,
                                                                int stateCount,
                                                                int patternCount,
                                                                int categoryCount,
                                                                int* resourceList,
                                                                int resourceCount,
                                                                long preferenceFlags,
                                                                long requirementFlags,
                                                                int eigenModelCount,
                                                                int partitionCount,
                                                                int calculateDerivatives,
                                                                long benchmarkFlags) {

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
    debugPatternCount = patternCount;
#endif

    if (rsrcList == NULL)
        beagleGetResourceList();

    if (implFactory == NULL)
        beagleGetFactoryList();

    int errorCode = BEAGLE_SUCCESS;

    PairedList* possibleResources = new PairedList;

    errorCode = filterResources(resourceList,
                                resourceCount,
                                preferenceFlags,
                                requirementFlags,
                                possibleResources);

    if (errorCode != BEAGLE_SUCCESS) {
        delete possibleResources;
        return NULL;
    }

    RsrcBenchPairList *filteredRsrcBenchList = new RsrcBenchPairList;

    for(PairedList::iterator it = possibleResources->begin(); it != possibleResources->end(); ++it) {
        int resource = (*it).second;

        BeagleBenchmarkedResource itResource;
        itResource.number        = resource;
        itResource.name          = rsrcList->list[resource].name;
        itResource.description   = rsrcList->list[resource].description;
        itResource.supportFlags  = rsrcList->list[resource].supportFlags;
        itResource.requiredFlags = rsrcList->list[resource].requiredFlags;

        filteredRsrcBenchList->push_back(itResource);
    }

    delete possibleResources;

    bool manualScaling = (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_NONE ? false : true);
    int benchmarkReplicates = BENCHMARK_REPLICATES;
    int rescaleFrequency =
        (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_ALWAYS ? 1 : BENCHMARK_REPLICATES*2);

    int resourceNumber;
    char* implName;
    long benchedFlags;
    double benchmarkResultCPU;

    bool instOnly = false;

    errorCode = beagle::benchmark::benchmarkResource(0,
                                  stateCount,
                                  tipCount,
                                  patternCount,
                                  manualScaling,
                                  categoryCount,
                                  benchmarkReplicates,
                                  compactBufferCount,
                                  rescaleFrequency,
                                  (calculateDerivatives ? true : false),
                                  calculateDerivatives,
                                  eigenModelCount,
                                  partitionCount,
                                  preferenceFlags | requirementFlags,
                                  0,
                                  &resourceNumber,
                                  &implName,
                                  &benchedFlags,
                                  &benchmarkResultCPU,
                                  instOnly);

    if (errorCode != BEAGLE_SUCCESS) {
        return NULL;
    }

    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {

        if ((*it).number == 0) {
            instOnly = true;
        } else {
            instOnly = false;
        }

        double itBenchmarkResult;

        (*it).returnCode = beagle::benchmark::benchmarkResource((*it).number,
                                                     stateCount,
                                                     tipCount,
                                                     patternCount,
                                                     manualScaling,
                                                     categoryCount,
                                                     benchmarkReplicates,
                                                     compactBufferCount,
                                                     rescaleFrequency,
                                                     (calculateDerivatives ? true : false),
                                                     calculateDerivatives,
                                                     eigenModelCount,
                                                     partitionCount,
                                                     preferenceFlags,
                                                     requirementFlags,
                                                     &resourceNumber,
                                                     &implName,
                                                     &benchedFlags,
                                                     &itBenchmarkResult,
                                                     instOnly);

        (*it).number         = resourceNumber;
        (*it).benchedFlags   = benchedFlags;
        (*it).implName       = implName;

        if ((*it).number == 0) {
            (*it).benchmarkResult = benchmarkResultCPU;
            (*it).performanceRatio = 1.0;
        } else {
            (*it).benchmarkResult = itBenchmarkResult;
            (*it).performanceRatio = benchmarkResultCPU / (*it).benchmarkResult;
        }
    }

    filteredRsrcBenchList->sort(compareBenchmarkResult); // order from fastest to slowest

   if (rsrcBenchList != NULL) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
    }

    rsrcBenchList = (BeagleBenchmarkedResourceList*) malloc(sizeof(BeagleBenchmarkedResourceList));
    rsrcBenchList->length = filteredRsrcBenchList->size();
    rsrcBenchList->list = (BeagleBenchmarkedResource*) malloc(sizeof(BeagleBenchmarkedResource) * rsrcBenchList->length);

    int i = 0;
    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {
        rsrcBenchList->list[i].number           = (*it).number;
        rsrcBenchList->list[i].name             = (*it).name;
        rsrcBenchList->list[i].description      = (*it).description;
        rsrcBenchList->list[i].supportFlags     = (*it).supportFlags;
        rsrcBenchList->list[i].requiredFlags    = (*it).requiredFlags;
        rsrcBenchList->list[i].returnCode       = (*it).returnCode;
        rsrcBenchList->list[i].implName         = (*it).implName;
        rsrcBenchList->list[i].benchedFlags     = (*it).benchedFlags;
        rsrcBenchList->list[i].benchmarkResult  = (*it).benchmarkResult;
        rsrcBenchList->list[i].performanceRatio = (*it).performanceRatio;
        i++;
    }

    delete filteredRsrcBenchList;

    return rsrcBenchList;
}